

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_ns_add(lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *uri)

{
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  undefined8 *object;
  char *pcVar4;
  LY_ERR LVar5;
  ly_ctx *ctx;
  lysc_node *__s1;
  lysc_node *__s1_00;
  char *pcVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(xmlctx->ns).count;
  while ((pcVar6 = uri, uVar7 != 0 &&
         (plVar1 = (xmlctx->ns).field_2.dnodes[uVar7 - 1],
         (xmlctx->elements).count <= *(uint *)&plVar1->parent))) {
    pcVar4 = *(char **)plVar1;
    if (prefix == (char *)0x0) {
      if (pcVar4 == (char *)0x0) {
        __s1 = plVar1->schema;
        iVar2 = strcmp((char *)__s1,uri);
        if (iVar2 == 0) goto LAB_00197a1d;
        ctx = xmlctx->ctx;
        pcVar4 = "Duplicate default XML namespaces \"%s\" and \"%s\".";
        __s1_00 = (lysc_node *)uri;
        goto LAB_00197a11;
      }
    }
    else if ((pcVar4 != (char *)0x0) && (iVar2 = ly_strncmp(pcVar4,prefix,prefix_len), iVar2 == 0))
    {
      __s1_00 = plVar1->schema;
      iVar2 = strcmp((char *)__s1_00,uri);
      if (iVar2 == 0) {
LAB_00197a1d:
        LVar5 = LY_SUCCESS;
      }
      else {
        ctx = xmlctx->ctx;
        __s1 = *(lysc_node **)plVar1;
        pcVar4 = "Duplicate XML NS prefix \"%s\" used for namespaces \"%s\" and \"%s\".";
LAB_00197a11:
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,pcVar4,__s1,__s1_00);
        LVar5 = LY_EVALID;
      }
      goto LAB_00197a22;
    }
    uVar7 = uVar7 - 1;
  }
  object = (undefined8 *)malloc(0x18);
  if (object == (undefined8 *)0x0) {
    LVar5 = LY_EMEM;
    ly_log(xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ns_add");
  }
  else {
    *(uint32_t *)(object + 2) = (xmlctx->elements).count;
    object[1] = uri;
    if (prefix == (char *)0x0) {
      *object = 0;
    }
    else {
      pcVar4 = strndup(prefix,prefix_len);
      *object = pcVar4;
      if (pcVar4 == (char *)0x0) {
        LVar5 = LY_EMEM;
        ly_log(xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ns_add");
        free(object);
        goto LAB_00197a22;
      }
    }
    LVar3 = ly_set_add(&xmlctx->ns,object,'\x01',(uint32_t *)0x0);
    pcVar6 = (char *)0x0;
    LVar5 = LY_SUCCESS;
    if (LVar3 != LY_SUCCESS) {
      free((void *)*object);
      free(object);
      pcVar6 = uri;
      LVar5 = LVar3;
    }
  }
LAB_00197a22:
  free(pcVar6);
  return LVar5;
}

Assistant:

LY_ERR
lyxml_ns_add(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len, char *uri)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyxml_ns *ns;
    uint32_t i;

    /* check for duplicates */
    if (xmlctx->ns.count) {
        i = xmlctx->ns.count;
        do {
            --i;
            ns = xmlctx->ns.objs[i];
            if (ns->depth < xmlctx->elements.count) {
                /* only namespaces of parents, no need to check further */
                break;
            } else if (prefix && ns->prefix && !ly_strncmp(ns->prefix, prefix, prefix_len)) {
                if (!strcmp(ns->uri, uri)) {
                    /* exact same prefix and namespace, ignore */
                    goto cleanup;
                }

                LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Duplicate XML NS prefix \"%s\" used for namespaces \"%s\" and \"%s\".",
                        ns->prefix, ns->uri, uri);
                rc = LY_EVALID;
                goto cleanup;
            } else if (!prefix && !ns->prefix) {
                if (!strcmp(ns->uri, uri)) {
                    /* exact same default namespace, ignore */
                    goto cleanup;
                }

                LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Duplicate default XML namespaces \"%s\" and \"%s\".", ns->uri, uri);
                rc = LY_EVALID;
                goto cleanup;
            }
        } while (i);
    }

    ns = malloc(sizeof *ns);
    LY_CHECK_ERR_GOTO(!ns, LOGMEM(xmlctx->ctx); rc = LY_EMEM, cleanup);

    /* we need to connect the depth of the element where the namespace is defined with the
     * namespace record to be able to maintain (remove) the record when the parser leaves
     * (to its sibling or back to the parent) the element where the namespace was defined */
    ns->depth = xmlctx->elements.count;

    ns->uri = uri;
    if (prefix) {
        ns->prefix = strndup(prefix, prefix_len);
        LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(xmlctx->ctx); free(ns); rc = LY_EMEM, cleanup);
    } else {
        ns->prefix = NULL;
    }

    rc = ly_set_add(&xmlctx->ns, ns, 1, NULL);
    LY_CHECK_ERR_GOTO(rc, free(ns->prefix); free(ns), cleanup);

    /* successfully stored */
    uri = NULL;

cleanup:
    free(uri);
    return rc;
}